

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.cpp
# Opt level: O0

string * helics::generateInterfaceQueryResults
                   (string_view request,InterfaceInfo *info,
                   function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                   *addHeaderInfo)

{
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  bool bVar1;
  reference block;
  InterfaceInfo *in_RDX;
  pointer in_RSI;
  string *in_RDI;
  json base_3;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *handle_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  shared_handle *__range2_2;
  json base_2;
  unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *handle_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  shared_handle *__range2_1;
  json base_1;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *handle;
  const_iterator __end2;
  const_iterator __begin2;
  shared_handle *__range2;
  json base;
  InterfaceInfo *in_stack_fffffffffffffc78;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *in_stack_fffffffffffffc80;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  *this;
  type in_stack_fffffffffffffc88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  size_type in_stack_fffffffffffffc98;
  char *in_stack_fffffffffffffca0;
  size_t in_stack_fffffffffffffca8;
  char *in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcc8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffcd0;
  json *in_stack_fffffffffffffce8;
  EndpointInfo *in_stack_fffffffffffffcf0;
  json *in_stack_fffffffffffffd08;
  PublicationInfo *in_stack_fffffffffffffd10;
  InputInfo *handle_00;
  function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  local_2c0;
  pointer local_2a0;
  InterfaceInfo *local_298;
  reference local_290;
  unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *local_288;
  __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
  local_280;
  undefined1 local_278 [24];
  undefined1 *local_260;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_258 [4];
  pointer local_218;
  InterfaceInfo *local_210;
  reference local_208;
  unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *local_200;
  __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
  local_1f8;
  undefined1 local_1f0 [24];
  undefined1 *local_1d8;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_1d0 [4];
  pointer local_190;
  InterfaceInfo *local_188;
  reference local_180;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *local_178;
  __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
  local_170;
  undefined1 local_168 [24];
  undefined1 *local_150;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_148 [2];
  undefined8 local_108;
  _Alloc_hider local_100;
  undefined8 base_00;
  InterfaceInfo *this_00;
  pointer local_88;
  InterfaceInfo *local_80;
  pointer local_18;
  InterfaceInfo *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDX;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
             (char *)in_stack_fffffffffffffc88);
  __x._M_str = in_stack_fffffffffffffcb0;
  __x._M_len = in_stack_fffffffffffffca8;
  __y._M_str = in_stack_fffffffffffffca0;
  __y._M_len = in_stack_fffffffffffffc98;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    InterfaceInfo::getPublications_abi_cxx11_(in_stack_fffffffffffffc78);
    generateStringVector_if<gmlc::libguarded::shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,std::__cxx11::string,helics::InterfaceHandle>,std::shared_mutex>,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceInfo_const&,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__0,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceInfo_const&,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__1>
              (in_RDI,&stack0xffffffffffffffa0);
    gmlc::libguarded::
    shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::~shared_lock_handle
              ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                *)0x5de932);
  }
  else {
    local_88 = local_18;
    local_80 = local_10;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
               (char *)in_stack_fffffffffffffc88);
    __x_00._M_str = in_stack_fffffffffffffcb0;
    __x_00._M_len = in_stack_fffffffffffffca8;
    __y_00._M_str = in_stack_fffffffffffffca0;
    __y_00._M_len = in_stack_fffffffffffffc98;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      InterfaceInfo::getInputs_abi_cxx11_(in_stack_fffffffffffffc78);
      generateStringVector_if<gmlc::libguarded::shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,std::__cxx11::string,helics::InterfaceHandle>,std::shared_mutex>,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceInfo_const&,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__2,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceInfo_const&,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__3>
                (in_RDI,&stack0xffffffffffffff50);
      gmlc::libguarded::
      shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
      ::~shared_lock_handle
                ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)0x5de9fd);
    }
    else {
      base_00 = local_18;
      this_00 = local_10;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
                 (char *)in_stack_fffffffffffffc88);
      __x_01._M_str = in_stack_fffffffffffffcb0;
      __x_01._M_len = in_stack_fffffffffffffca8;
      __y_01._M_str = in_stack_fffffffffffffca0;
      __y_01._M_len = in_stack_fffffffffffffc98;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        InterfaceInfo::getEndpoints_abi_cxx11_(in_stack_fffffffffffffc78);
        generateStringVector_if<gmlc::libguarded::shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,std::__cxx11::string,helics::InterfaceHandle>,std::shared_mutex>,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceInfo_const&,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__4,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceInfo_const&,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__5>
                  (in_RDI,&stack0xffffffffffffff10);
        gmlc::libguarded::
        shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
        ::~shared_lock_handle
                  ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                    *)0x5deac8);
      }
      else {
        local_108 = local_18;
        local_100._M_p = (pointer)local_10;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
                   (char *)in_stack_fffffffffffffc88);
        __x_02._M_str = in_stack_fffffffffffffcb0;
        __x_02._M_len = in_stack_fffffffffffffca8;
        __y_02._M_str = in_stack_fffffffffffffca0;
        __y_02._M_len = in_stack_fffffffffffffc98;
        bVar1 = std::operator==(__x_02,__y_02);
        if (bVar1) {
          handle_00 = (InputInfo *)&stack0xfffffffffffffed8;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          std::
          function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
          ::operator()(in_stack_fffffffffffffc80,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffffc78);
          CLI::std::
          initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
          ::initializer_list(local_148);
          init._M_len = in_stack_fffffffffffffc98;
          init._M_array = (iterator)in_stack_fffffffffffffc90;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::array(init);
          block = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffc90,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)in_stack_fffffffffffffc88);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffc80);
          InterfaceInfo::getInputs_abi_cxx11_(in_stack_fffffffffffffc78);
          local_150 = local_168;
          local_170._M_current =
               (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
               gmlc::libguarded::
               shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
               ::begin((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                        *)in_stack_fffffffffffffc78);
          local_178 = (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                      gmlc::libguarded::
                      shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                      ::end((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                             *)in_stack_fffffffffffffc78);
          while( true ) {
            bVar1 = __gnu_cxx::
                    operator==<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                              ((__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                                *)in_stack_fffffffffffffc80,
                               (__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                                *)in_stack_fffffffffffffc78);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            local_180 = __gnu_cxx::
                        __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                        ::operator*(&local_170);
            std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator->
                      ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                       0x5ded1c);
            bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x5ded28);
            if (!bVar1) {
              std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::operator*
                        ((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                         in_stack_fffffffffffffc80);
              storeInput(handle_00,block);
            }
            __gnu_cxx::
            __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
            ::operator++(&local_170);
          }
          gmlc::libguarded::
          shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          ::~shared_lock_handle
                    ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                      *)0x5dec90);
          fileops::generateJsonString
                    ((json *)in_stack_fffffffffffffc88,
                     SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffc80);
        }
        else {
          local_190 = local_18;
          local_188 = local_10;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
                     (char *)in_stack_fffffffffffffc88);
          __x_03._M_str = in_stack_fffffffffffffcb0;
          __x_03._M_len = in_stack_fffffffffffffca8;
          __y_03._M_str = in_stack_fffffffffffffca0;
          __y_03._M_len = in_stack_fffffffffffffc98;
          bVar1 = std::operator==(__x_03,__y_03);
          if (bVar1) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
            std::
            function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
            ::operator()(in_stack_fffffffffffffc80,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)in_stack_fffffffffffffc78);
            CLI::std::
            initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            ::initializer_list(local_1d0);
            init_00._M_len = in_stack_fffffffffffffc98;
            init_00._M_array = (iterator)in_stack_fffffffffffffc90;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::array(init_00);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffc90,
                        (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffc88);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffffc80);
            InterfaceInfo::getPublications_abi_cxx11_(in_stack_fffffffffffffc78);
            local_1d8 = local_1f0;
            local_1f8._M_current =
                 (unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                  *)gmlc::libguarded::
                    shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                    ::begin((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                             *)in_stack_fffffffffffffc78);
            local_200 = (unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                         *)gmlc::libguarded::
                           shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                           ::end((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                                  *)in_stack_fffffffffffffc78);
            while( true ) {
              bVar1 = __gnu_cxx::
                      operator==<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                                ((__normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                                  *)in_stack_fffffffffffffc80,
                                 (__normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                                  *)in_stack_fffffffffffffc78);
              if (((bVar1 ^ 0xffU) & 1) == 0) break;
              local_208 = __gnu_cxx::
                          __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
                          ::operator*(&local_1f8);
              std::
              unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>::
              operator->((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                          *)0x5defbb);
              bVar1 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x5defc7);
              if (!bVar1) {
                std::
                unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>::
                operator*((unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>
                           *)in_stack_fffffffffffffc80);
                storePublication(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
              }
              __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_*,_std::vector<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>,_std::allocator<std::unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_>_>_>_>
              ::operator++(&local_1f8);
            }
            gmlc::libguarded::
            shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
            ::~shared_lock_handle
                      ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                        *)0x5def2f);
            fileops::generateJsonString
                      ((json *)in_stack_fffffffffffffc88,
                       SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffffc80);
          }
          else {
            local_218 = local_18;
            local_210 = local_10;
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90
                       ,(char *)in_stack_fffffffffffffc88);
            __x_04._M_str = in_stack_fffffffffffffcb0;
            __x_04._M_len = in_stack_fffffffffffffca8;
            __y_04._M_str = in_stack_fffffffffffffca0;
            __y_04._M_len = in_stack_fffffffffffffc98;
            bVar1 = std::operator==(__x_04,__y_04);
            if (bVar1) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
              std::
              function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              ::operator()(in_stack_fffffffffffffc80,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_fffffffffffffc78);
              CLI::std::
              initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              ::initializer_list(local_258);
              init_01._M_len = in_stack_fffffffffffffc98;
              init_01._M_array = (iterator)in_stack_fffffffffffffc90;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::array(init_01);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffffc90,
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)in_stack_fffffffffffffc88);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffffc80);
              InterfaceInfo::getEndpoints_abi_cxx11_(in_stack_fffffffffffffc78);
              local_260 = local_278;
              local_280._M_current =
                   (unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_> *)
                   gmlc::libguarded::
                   shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                   ::begin((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                            *)in_stack_fffffffffffffc78);
              local_288 = (unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                           *)gmlc::libguarded::
                             shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                             ::end((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                                    *)in_stack_fffffffffffffc78);
              while( true ) {
                bVar1 = __gnu_cxx::
                        operator==<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                                  ((__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                                    *)in_stack_fffffffffffffc80,
                                   (__normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                                    *)in_stack_fffffffffffffc78);
                if (((bVar1 ^ 0xffU) & 1) == 0) break;
                local_290 = __gnu_cxx::
                            __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                            ::operator*(&local_280);
                std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>::
                operator->((unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                            *)0x5df25a);
                bVar1 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x5df266);
                if (!bVar1) {
                  in_stack_fffffffffffffc88 =
                       std::
                       unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                       ::operator*((unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                                    *)in_stack_fffffffffffffc80);
                  storeEndpoint(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
                }
                __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_*,_std::vector<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>_>
                ::operator++(&local_280);
              }
              gmlc::libguarded::
              shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
              ::~shared_lock_handle
                        ((shared_lock_handle<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                          *)0x5df1ce);
              fileops::generateJsonString
                        ((json *)in_stack_fffffffffffffc88,
                         SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)in_stack_fffffffffffffc80);
            }
            else {
              local_2a0 = local_18;
              local_298 = local_10;
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88);
              __x_05._M_str = in_stack_fffffffffffffcb0;
              __x_05._M_len = in_stack_fffffffffffffca8;
              __y_05._M_str = in_stack_fffffffffffffca0;
              __y_05._M_len = in_stack_fffffffffffffc98;
              bVar1 = std::operator==(__x_05,__y_05);
              if (bVar1) {
                this = &local_2c0;
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)this,in_stack_fffffffffffffc78);
                std::
                function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                ::operator()(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)in_stack_fffffffffffffc78);
                InterfaceInfo::generateInferfaceConfig(this_00,(json *)base_00);
                fileops::generateJsonString
                          ((json *)in_stack_fffffffffffffc88,SUB81((ulong)this >> 0x38,0));
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)this);
              }
              else {
                std::__cxx11::string::string(in_stack_fffffffffffffc90);
              }
            }
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string generateInterfaceQueryResults(std::string_view request,
                                          const InterfaceInfo& info,
                                          const std::function<void(nlohmann::json&)>& addHeaderInfo)
{
    if (request == "publications") {
        return generateStringVector_if(
            info.getPublications(),
            [](auto& pub) { return pub->key; },
            [](auto& pub) { return !pub->key.empty(); });
    }
    if (request == "inputs") {
        return generateStringVector_if(
            info.getInputs(),
            [](auto& inp) { return inp->key; },
            [](auto& inp) { return !inp->key.empty(); });
    }

    if (request == "endpoints") {
        return generateStringVector_if(
            info.getEndpoints(),
            [](auto& ept) { return ept->key; },
            [](auto& ept) { return !ept->key.empty(); });
    }

    if (request == "input_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["inputs"] = nlohmann::json::array();
        for (const auto& handle : info.getInputs()) {
            if (!handle->key.empty()) {
                storeInput(*handle, base);
            }
        }
        return fileops::generateJsonString(base);
    }

    if (request == "publication_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["publications"] = nlohmann::json::array();
        for (const auto& handle : info.getPublications()) {
            if (!handle->key.empty()) {
                storePublication(*handle, base);
            }
        }
        return fileops::generateJsonString(base);
    }

    if (request == "endpoint_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["endpoints"] = nlohmann::json::array();
        for (const auto& handle : info.getEndpoints()) {
            if (!handle->key.empty()) {
                storeEndpoint(*handle, base);
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "interface_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        info.generateInferfaceConfig(base);
        return fileops::generateJsonString(base);
    }

    return std::string{};
}